

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible_match_test.cc
# Opt level: O2

void re2::PossibleMatchRangeHandWritten(void)

{
  bool bVar1;
  ostream *poVar2;
  Regexp *this;
  Prog *this_00;
  int iVar3;
  StringPiece *src;
  long lVar4;
  char *local_238;
  string max;
  string min;
  StringPiece local_1e0;
  string local_1d0;
  LogMessage local_1b0;
  
  for (lVar4 = 0; lVar4 != 0x43; lVar4 = lVar4 + 1) {
    iVar3 = 2;
    while( true ) {
      if (iVar3 == 0) break;
      min._M_dataplus._M_p = (pointer)&min.field_2;
      min._M_string_length = 0;
      max._M_dataplus._M_p = (pointer)&max.field_2;
      max._M_string_length = 0;
      min.field_2._M_local_buf[0] = '\0';
      max.field_2._M_local_buf[0] = '\0';
      if (iVar3 == 2) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x6e,0);
        poVar2 = std::operator<<((ostream *)&local_1b0.str_,"Checking regexp=");
        local_238 = (char *)(&tests)[lVar4 * 4];
        StringPiece::StringPiece(&local_1e0,local_238);
        CEscape_abi_cxx11_(&local_1d0,(re2 *)&local_1e0,src);
        std::operator<<(poVar2,(string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        LogMessage::~LogMessage(&local_1b0);
        StringPiece::StringPiece((StringPiece *)&local_1b0,local_238);
        this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
        if (this == (Regexp *)0x0) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x70);
          std::operator<<((ostream *)&local_1b0.str_,"Check failed: re");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        this_00 = Regexp::CompileToProg(this,0);
        if (this_00 == (Prog *)0x0) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x72);
          std::operator<<((ostream *)&local_1b0.str_,"Check failed: prog");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        bVar1 = Prog::PossibleMatchRange(this_00,&min,&max,(&DAT_00151ae8)[lVar4 * 8]);
        if (!bVar1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x73);
          poVar2 = std::operator<<((ostream *)&local_1b0.str_,
                                   "Check failed: prog->PossibleMatchRange(&min, &max, t.maxlen)");
          poVar2 = std::operator<<(poVar2," ");
          std::operator<<(poVar2,local_238);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
        Prog::~Prog(this_00);
        operator_delete(this_00);
        Regexp::Decref(this);
      }
      else {
        local_238 = (char *)(&tests)[lVar4 * 4];
        RE2::RE2((RE2 *)&local_1b0,local_238);
        bVar1 = RE2::PossibleMatchRange((RE2 *)&local_1b0,&min,&max,(&DAT_00151ae8)[lVar4 * 8]);
        RE2::~RE2((RE2 *)&local_1b0);
        if (!bVar1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x78);
          std::operator<<((ostream *)&local_1b0.str_,
                          "Check failed: RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen)");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
        }
      }
      bVar1 = std::operator==((char *)(&DAT_00151af0)[lVar4 * 4],&min);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7a);
        poVar2 = std::operator<<((ostream *)&local_1b0.str_,"Check failed: (t.min) == (min)");
        std::operator<<(poVar2,local_238);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      bVar1 = std::operator==((char *)(&DAT_00151af8)[lVar4 * 4],&max);
      if (!bVar1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7b);
        poVar2 = std::operator<<((ostream *)&local_1b0.str_,"Check failed: (t.max) == (max)");
        std::operator<<(poVar2,local_238);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      std::__cxx11::string::~string((string *)&max);
      std::__cxx11::string::~string((string *)&min);
      iVar3 = iVar3 + -1;
    }
  }
  return;
}

Assistant:

TEST(PossibleMatchRange, HandWritten) {
  for (int i = 0; i < arraysize(tests); i++) {
    for (int j = 0; j < 2; j++) {
      const PrefixTest& t = tests[i];
      string min, max;
      if (j == 0) {
        LOG(INFO) << "Checking regexp=" << CEscape(t.regexp);
        Regexp* re = Regexp::Parse(t.regexp, Regexp::LikePerl, NULL);
        CHECK(re);
        Prog* prog = re->CompileToProg(0);
        CHECK(prog);
        CHECK(prog->PossibleMatchRange(&min, &max, t.maxlen))
          << " " << t.regexp;
        delete prog;
        re->Decref();
      } else {
        CHECK(RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen));
      }
      EXPECT_EQ(t.min, min) << t.regexp;
      EXPECT_EQ(t.max, max) << t.regexp;
    }
  }
}